

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void server_receive(Plug *plug,int urgent,char *data,size_t len)

{
  server *srv;
  size_t len_local;
  char *data_local;
  int urgent_local;
  Plug *plug_local;
  
  if (plug[-7].vt != (PlugVtable *)0x0) {
    log_packet((LogContext *)plug[-7].vt,0,-1,(char *)0x0,data,len,0,(logblank_t *)0x0,
               (unsigned_long *)0x0,0,(char *)0x0);
  }
  bufchain_add((bufchain *)(plug + -0x1c),data,len);
  if ((((ulong)plug[1].vt & 0x100000000) == 0) && (plug[0xe].vt != (PlugVtable *)0x0)) {
    queue_idempotent_callback((IdempotentCallback *)&plug[0xe].vt[4].closing);
  }
  return;
}

Assistant:

static void server_receive(
    Plug *plug, int urgent, const char *data, size_t len)
{
    server *srv = container_of(plug, server, plug);

    /* Log raw data, if we're in that mode. */
    if (srv->logctx)
        log_packet(srv->logctx, PKT_INCOMING, -1, NULL, data, len,
                   0, NULL, NULL, 0, NULL);

    bufchain_add(&srv->in_raw, data, len);
    if (!srv->frozen && srv->bpp)
        queue_idempotent_callback(&srv->bpp->ic_in_raw);
}